

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O0

bool __thiscall
wallet::WalletBatch::WriteCryptedDescriptorKey
          (WalletBatch *this,uint256 *desc_id,CPubKey *pubkey,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *secret)

{
  bool bVar1;
  byte bVar2;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
  *in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  uint256 *in_stack_fffffffffffffdb8;
  undefined1 fOverwrite;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
  *key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffdc0;
  WalletBatch *pWVar3;
  undefined7 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdcf;
  undefined1 local_1e1 [240];
  WalletBatch local_f1 [14];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pWVar3 = local_f1;
  std::make_pair<uint256_const&,CPubKey_const&>
            (in_stack_fffffffffffffdb8,
             (CPubKey *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
  fOverwrite = (undefined1)((ulong)in_stack_fffffffffffffdb8 >> 0x38);
  std::make_pair<std::__cxx11::string_const&,std::pair<uint256,CPubKey>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
             (pair<uint256,_CPubKey> *)in_stack_fffffffffffffda8);
  bVar1 = WriteIC<std::pair<std::__cxx11::string,std::pair<uint256,CPubKey>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    (pWVar3,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
                             *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                     in_stack_fffffffffffffdc0,(bool)fOverwrite);
  bVar2 = bVar1 ^ 0xff;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
  ::~pair(in_stack_fffffffffffffda8);
  bVar1 = (bVar2 & 1) == 0;
  if (bVar1) {
    key = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
           *)local_1e1;
    std::make_pair<uint256_const&,CPubKey_const&>
              ((uint256 *)key,
               (CPubKey *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
    pWVar3 = (WalletBatch *)(local_1e1 + 0x61);
    std::make_pair<std::__cxx11::string_const&,std::pair<uint256,CPubKey>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
               (pair<uint256,_CPubKey> *)in_stack_fffffffffffffda8);
    EraseIC<std::pair<std::__cxx11::string,std::pair<uint256,CPubKey>>>(pWVar3,key);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
    ::~pair(in_stack_fffffffffffffda8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool WalletBatch::WriteCryptedDescriptorKey(const uint256& desc_id, const CPubKey& pubkey, const std::vector<unsigned char>& secret)
{
    if (!WriteIC(std::make_pair(DBKeys::WALLETDESCRIPTORCKEY, std::make_pair(desc_id, pubkey)), secret, false)) {
        return false;
    }
    EraseIC(std::make_pair(DBKeys::WALLETDESCRIPTORKEY, std::make_pair(desc_id, pubkey)));
    return true;
}